

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O0

bool __thiscall
S2BooleanOperation::Impl::ProcessIncidentEdges
          (Impl *this,ShapeEdge *a,S2ContainsPointQuery<S2ShapeIndex> *query,CrossingProcessor *cp)

{
  CrossingProcessor *pCVar1;
  bool bVar2;
  S2Point *p;
  size_type sVar3;
  ostream *poVar4;
  S2ShapeIndex *b_index;
  ShapeEdgeId a_id;
  int __c;
  value_type *__x;
  undefined1 local_110 [8];
  CrossingIterator next_crossing;
  IndexCrossing local_d0;
  byte local_b9;
  S2LogMessage local_b8;
  S2LogMessageVoidify local_a1;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_a0;
  IndexCrossing *local_98;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_90;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_88;
  IndexCrossing *local_80;
  __normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
  local_78;
  anon_class_16_2_d7082894 local_60;
  EdgeVisitor local_50;
  CrossingProcessor *local_30;
  CrossingProcessor *cp_local;
  S2ContainsPointQuery<S2ShapeIndex> *query_local;
  ShapeEdge *a_local;
  Impl *this_local;
  
  local_30 = cp;
  cp_local = (CrossingProcessor *)query;
  query_local = (S2ContainsPointQuery<S2ShapeIndex> *)a;
  a_local = (ShapeEdge *)this;
  std::
  vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
  ::clear(&this->tmp_crossings_);
  pCVar1 = cp_local;
  p = s2shapeutil::ShapeEdge::v0((ShapeEdge *)query_local);
  local_60.a = (ShapeEdge *)query_local;
  local_60.this = this;
  std::function<bool(s2shapeutil::ShapeEdge_const&)>::
  function<S2BooleanOperation::Impl::ProcessIncidentEdges(s2shapeutil::ShapeEdge_const&,S2ContainsPointQuery<S2ShapeIndex>*,S2BooleanOperation::Impl::CrossingProcessor*)::__0,void>
            ((function<bool(s2shapeutil::ShapeEdge_const&)> *)&local_50,&local_60);
  S2ContainsPointQuery<S2ShapeIndex>::VisitIncidentEdges
            ((S2ContainsPointQuery<S2ShapeIndex> *)pCVar1,p,&local_50);
  std::function<bool_(const_s2shapeutil::ShapeEdge_&)>::~function(&local_50);
  bVar2 = std::
          vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
          ::empty(&this->tmp_crossings_);
  if (bVar2) {
    bVar2 = CrossingProcessor::inside(local_30);
    this_local._7_1_ = (bool)((bVar2 ^ 0xffU) & 1);
  }
  else {
    sVar3 = std::
            vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
            ::size(&this->tmp_crossings_);
    if (1 < sVar3) {
      local_78._M_current =
           (IndexCrossing *)
           std::
           vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ::begin(&this->tmp_crossings_);
      local_80 = (IndexCrossing *)
                 std::
                 vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ::end(&this->tmp_crossings_);
      std::
      sort<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>>
                (local_78,(__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
                           )local_80);
      local_90._M_current =
           (IndexCrossing *)
           std::
           vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ::begin(&this->tmp_crossings_);
      local_98 = (IndexCrossing *)
                 std::
                 vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
                 ::end(&this->tmp_crossings_);
      local_88 = std::
                 adjacent_find<__gnu_cxx::__normal_iterator<S2BooleanOperation::Impl::IndexCrossing*,std::vector<S2BooleanOperation::Impl::IndexCrossing,std::allocator<S2BooleanOperation::Impl::IndexCrossing>>>>
                           (local_90,(__normal_iterator<S2BooleanOperation::Impl::IndexCrossing_*,_std::vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>_>
                                      )local_98);
      local_a0._M_current =
           (IndexCrossing *)
           std::
           vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
           ::end(&this->tmp_crossings_);
      bVar2 = __gnu_cxx::operator==(&local_88,&local_a0);
      local_b9 = 0;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        S2FatalLogMessage::S2FatalLogMessage
                  ((S2FatalLogMessage *)&local_b8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
                   ,0x749,kFatal,(ostream *)&std::cerr);
        local_b9 = 1;
        poVar4 = S2LogMessage::stream(&local_b8);
        poVar4 = std::operator<<(poVar4,
                                 "Check failed: std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) == tmp_crossings_.end() "
                                );
        S2LogMessageVoidify::operator&(&local_a1,poVar4);
      }
      if ((local_b9 & 1) != 0) {
        S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_b8);
      }
    }
    next_crossing._40_8_ = kSentinel;
    IndexCrossing::IndexCrossing(&local_d0,kSentinel,kSentinel);
    __x = &local_d0;
    std::
    vector<S2BooleanOperation::Impl::IndexCrossing,_std::allocator<S2BooleanOperation::Impl::IndexCrossing>_>
    ::push_back(&this->tmp_crossings_,__x);
    b_index = (S2ShapeIndex *)
              S2ContainsPointQuery<S2ShapeIndex>::index
                        ((S2ContainsPointQuery<S2ShapeIndex> *)cp_local,(char *)__x,__c);
    CrossingIterator::CrossingIterator
              ((CrossingIterator *)local_110,b_index,&this->tmp_crossings_,false);
    pCVar1 = local_30;
    a_id = s2shapeutil::ShapeEdge::id((ShapeEdge *)query_local);
    this_local._7_1_ = CrossingProcessor::ProcessEdge(pCVar1,a_id,(CrossingIterator *)local_110);
  }
  return this_local._7_1_;
}

Assistant:

bool S2BooleanOperation::Impl::ProcessIncidentEdges(
    const ShapeEdge& a, S2ContainsPointQuery<S2ShapeIndex>* query,
    CrossingProcessor* cp) {
  tmp_crossings_.clear();
  query->VisitIncidentEdges(a.v0(), [&a, this](const ShapeEdge& b) {
      return AddIndexCrossing(a, b, false /*is_interior*/, &tmp_crossings_);
    });
  // Fast path for the common case where there are no incident edges.  We
  // return false (terminating early) if the first chain edge will be emitted.
  if (tmp_crossings_.empty()) {
    return !cp->inside();
  }
  // Otherwise we invoke the full CrossingProcessor logic to determine whether
  // the first chain edge will be emitted.
  if (tmp_crossings_.size() > 1) {
    std::sort(tmp_crossings_.begin(), tmp_crossings_.end());
    // VisitIncidentEdges() should not generate any duplicate values.
    S2_DCHECK(std::adjacent_find(tmp_crossings_.begin(), tmp_crossings_.end()) ==
           tmp_crossings_.end());
  }
  tmp_crossings_.push_back(IndexCrossing(kSentinel, kSentinel));
  CrossingIterator next_crossing(&query->index(), &tmp_crossings_,
                                 false /*crossings_complete*/);
  return cp->ProcessEdge(a.id(),  &next_crossing);
}